

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

sector_t_conflict * __thiscall
sector_t::FindModelCeilingSector(sector_t *this,double floordestheight)

{
  sector_t_conflict *psVar1;
  double dVar2;
  sector_t_conflict *sec;
  int i;
  double floordestheight_local;
  sector_t_conflict *this_local;
  
  sec._4_4_ = 0;
  do {
    if (this->linecount <= sec._4_4_) {
      return (sector_t_conflict *)0x0;
    }
    psVar1 = getNextSector(this->lines[sec._4_4_],(sector_t_conflict *)this);
    if (psVar1 != (sector_t_conflict *)0x0) {
      dVar2 = secplane_t::ZatPoint(&psVar1->ceilingplane,this->lines[sec._4_4_]->v1);
      if ((dVar2 == floordestheight) && (!NAN(dVar2) && !NAN(floordestheight))) {
        return psVar1;
      }
      dVar2 = secplane_t::ZatPoint(&psVar1->ceilingplane,this->lines[sec._4_4_]->v2);
      if ((dVar2 == floordestheight) && (!NAN(dVar2) && !NAN(floordestheight))) {
        return psVar1;
      }
    }
    sec._4_4_ = sec._4_4_ + 1;
  } while( true );
}

Assistant:

sector_t *sector_t::FindModelCeilingSector (double floordestheight) const
{
	int i;
	sector_t *sec;

	//jff 5/23/98 don't disturb sec->linecount while searching
	// but allow early exit in old demos
	for (i = 0; i < linecount; i++)
	{
		sec = getNextSector (lines[i], this);
		if (sec != NULL &&
			(sec->ceilingplane.ZatPoint(lines[i]->v1) == floordestheight ||
			 sec->ceilingplane.ZatPoint(lines[i]->v2) == floordestheight))
		{
			return sec;
		}
	}
	return NULL;
}